

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::Swap
          (RepeatedField<unsigned_long> *this,RepeatedField<unsigned_long> *other)

{
  unsigned_long *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (this != other) {
    puVar1 = this->elements_;
    this->elements_ = other->elements_;
    iVar2 = other->total_size_;
    other->elements_ = puVar1;
    iVar3 = this->current_size_;
    iVar4 = this->total_size_;
    this->current_size_ = other->current_size_;
    this->total_size_ = iVar2;
    other->current_size_ = iVar3;
    other->total_size_ = iVar4;
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  Element* swap_elements     = elements_;
  int      swap_current_size = current_size_;
  int      swap_total_size   = total_size_;

  elements_     = other->elements_;
  current_size_ = other->current_size_;
  total_size_   = other->total_size_;

  other->elements_     = swap_elements;
  other->current_size_ = swap_current_size;
  other->total_size_   = swap_total_size;
}